

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission_parse.cpp
# Opt level: O0

void __thiscall
FIntermissionActionTextscreen::FIntermissionActionTextscreen(FIntermissionActionTextscreen *this)

{
  FIntermissionActionTextscreen *this_local;
  
  FIntermissionAction::FIntermissionAction(&this->super_FIntermissionAction);
  (this->super_FIntermissionAction)._vptr_FIntermissionAction =
       (_func_int **)&PTR__FIntermissionActionTextscreen_009ec8e0;
  FString::FString(&this->mText);
  (this->super_FIntermissionAction).mSize = 0x80;
  (this->super_FIntermissionAction).mClass = DIntermissionScreenText::RegistrationInfo.MyClass;
  this->mTextSpeed = 2;
  this->mTextX = -1;
  this->mTextY = -1;
  this->mTextColor = CR_UNTRANSLATED;
  this->mTextDelay = 10;
  return;
}

Assistant:

FIntermissionActionTextscreen::FIntermissionActionTextscreen()
{
	mSize = sizeof(FIntermissionActionTextscreen);
	mClass = RUNTIME_CLASS(DIntermissionScreenText);
	mTextSpeed = 2;
	mTextX = -1;	// use gameinfo defaults
	mTextY = -1;
	mTextColor = CR_UNTRANSLATED;
	mTextDelay = 10;
}